

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float tcu::sampleLevelArray1DCompare
                (ConstPixelBufferAccess *levels,int numLevels,Sampler *sampler,float ref,float s,
                float lod,IVec2 *offset)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  FilterMode local_74;
  float t1;
  float t0;
  float f;
  FilterMode levelFilter_1;
  int level1;
  int level0;
  int maxLevel_1;
  FilterMode levelFilter;
  int level;
  int maxLevel;
  FilterMode filterMode;
  bool magnified;
  IVec2 *offset_local;
  float lod_local;
  float s_local;
  float ref_local;
  Sampler *sampler_local;
  int numLevels_local;
  ConstPixelBufferAccess *levels_local;
  
  if (sampler->lodThreshold < lod) {
    local_74 = sampler->minFilter;
  }
  else {
    local_74 = sampler->magFilter;
  }
  switch(local_74) {
  case NEAREST:
    levels_local._4_4_ =
         ConstPixelBufferAccess::sample1DCompare(levels,sampler,local_74,ref,s,offset);
    break;
  case LINEAR:
    levels_local._4_4_ =
         ConstPixelBufferAccess::sample1DCompare(levels,sampler,local_74,ref,s,offset);
    break;
  case NEAREST_MIPMAP_NEAREST:
  case LINEAR_MIPMAP_NEAREST:
    fVar3 = deFloatCeil(lod + 0.5);
    iVar1 = deClamp32((int)fVar3 + -1,0,numLevels + -1);
    levels_local._4_4_ =
         ConstPixelBufferAccess::sample1DCompare
                   (levels + iVar1,sampler,(uint)(local_74 == LINEAR_MIPMAP_NEAREST),ref,s,offset);
    break;
  case NEAREST_MIPMAP_LINEAR:
  case LINEAR_MIPMAP_LINEAR:
    fVar3 = deFloatFloor(lod);
    iVar1 = deClamp32((int)fVar3,0,numLevels + -1);
    iVar2 = de::min<int>(numLevels + -1,iVar1 + 1);
    fVar3 = deFloatFrac(lod);
    fVar4 = ConstPixelBufferAccess::sample1DCompare
                      (levels + iVar1,sampler,(uint)(local_74 == LINEAR_MIPMAP_LINEAR),ref,s,offset)
    ;
    fVar5 = ConstPixelBufferAccess::sample1DCompare
                      (levels + iVar2,sampler,(uint)(local_74 == LINEAR_MIPMAP_LINEAR),ref,s,offset)
    ;
    levels_local._4_4_ = fVar4 * (1.0 - fVar3) + fVar5 * fVar3;
    break;
  default:
    levels_local._4_4_ = 0.0;
  }
  return levels_local._4_4_;
}

Assistant:

float sampleLevelArray1DCompare (const ConstPixelBufferAccess* levels, int numLevels, const Sampler& sampler, float ref, float s, float lod, const IVec2& offset)
{
	bool					magnified	= lod <= sampler.lodThreshold;
	Sampler::FilterMode		filterMode	= magnified ? sampler.magFilter : sampler.minFilter;

	switch (filterMode)
	{
		case Sampler::NEAREST:	return levels[0].sample1DCompare(sampler, filterMode, ref, s, offset);
		case Sampler::LINEAR:	return levels[0].sample1DCompare(sampler, filterMode, ref, s, offset);

		case Sampler::NEAREST_MIPMAP_NEAREST:
		case Sampler::LINEAR_MIPMAP_NEAREST:
		{
			int					maxLevel	= (int)numLevels-1;
			int					level		= deClamp32((int)deFloatCeil(lod + 0.5f) - 1, 0, maxLevel);
			Sampler::FilterMode	levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_NEAREST) ? Sampler::LINEAR : Sampler::NEAREST;

			return levels[level].sample1DCompare(sampler, levelFilter, ref, s, offset);
		}

		case Sampler::NEAREST_MIPMAP_LINEAR:
		case Sampler::LINEAR_MIPMAP_LINEAR:
		{
			int					maxLevel	= (int)numLevels-1;
			int					level0		= deClamp32((int)deFloatFloor(lod), 0, maxLevel);
			int					level1		= de::min(maxLevel, level0 + 1);
			Sampler::FilterMode	levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_LINEAR) ? Sampler::LINEAR : Sampler::NEAREST;
			float				f			= deFloatFrac(lod);
			float				t0			= levels[level0].sample1DCompare(sampler, levelFilter, ref, s, offset);
			float				t1			= levels[level1].sample1DCompare(sampler, levelFilter, ref, s, offset);

			return t0*(1.0f - f) + t1*f;
		}

		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}